

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O3

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *interfaceNode,Reader *replacement)

{
  long lVar1;
  CapTableReader *pCVar2;
  void *pvVar3;
  Reader *pRVar4;
  ulong uVar5;
  ListElementCount LVar6;
  WirePointer WVar7;
  WirePointer WVar8;
  int iVar9;
  size_t sVar10;
  ElementCount EVar11;
  SegmentReader *pSVar12;
  SegmentReader *pSVar13;
  bool bVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  Vector<unsigned_long> superclasses;
  Vector<unsigned_long> replacementSuperclasses;
  Reader replacementMethods;
  Reader methods;
  StructReader local_108;
  StructReader local_d8;
  Reader *local_a0;
  ListReader local_98;
  Reader *local_68;
  ListReader local_60;
  
  local_98.segment._0_4_ = 0;
  local_98.segment._4_4_ = 0;
  local_98.capTable._0_4_ = 0;
  local_98.capTable._4_4_ = 0;
  local_108.segment = (SegmentReader *)0x0;
  local_108.capTable = (CapTableReader *)0x0;
  local_108.data = (SegmentReader *)0x0;
  local_108.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  local_d8.data = (SegmentReader *)0x0;
  local_d8.segment = (SegmentReader *)0x0;
  local_d8.capTable = (CapTableReader *)0x0;
  local_d8.pointers = (WirePointer *)&kj::NullArrayDisposer::instance;
  bVar14 = (interfaceNode->_reader).pointerCount < 5;
  local_98.ptr = (byte *)((interfaceNode->_reader).pointers + 4);
  if (bVar14) {
    local_98.ptr = (byte *)(WirePointer *)0x0;
  }
  local_98.elementCount = 0x7fffffff;
  if (!bVar14) {
    local_98.segment._0_4_ = *(undefined4 *)&(interfaceNode->_reader).segment;
    local_98.segment._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).segment + 4);
    local_98.capTable._0_4_ = *(undefined4 *)&(interfaceNode->_reader).capTable;
    local_98.capTable._4_4_ = *(undefined4 *)((long)&(interfaceNode->_reader).capTable + 4);
    local_98.elementCount = (interfaceNode->_reader).nestingLimit;
  }
  local_a0 = replacement;
  local_68 = interfaceNode;
  _::PointerReader::getList(&local_60,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
  LVar6 = local_60.elementCount;
  if (local_60.elementCount != 0) {
    EVar11 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_98,&local_60,EVar11);
      if (local_98.structDataSize < 0x40) {
        WVar7.offsetAndKind.value = 0;
        WVar7.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar7 = *(WirePointer *)local_98.ptr;
      }
      if (local_108.capTable == (CapTableReader *)local_108.data) {
        sVar10 = (long)local_108.capTable - (long)local_108.segment >> 2;
        if ((SegmentReader *)local_108.capTable == local_108.segment) {
          sVar10 = 4;
        }
        kj::Vector<unsigned_long>::setCapacity((Vector<unsigned_long> *)&local_108,sVar10);
      }
      ((SegmentReader *)local_108.capTable)->arena = (Arena *)WVar7;
      local_108.capTable = (CapTableReader *)&((SegmentReader *)local_108.capTable)->id;
      EVar11 = EVar11 + 1;
    } while (LVar6 != EVar11);
  }
  bVar14 = (local_a0->_reader).pointerCount < 5;
  local_98.ptr = (byte *)((local_a0->_reader).pointers + 4);
  if (bVar14) {
    local_98.ptr = (byte *)(WirePointer *)0x0;
  }
  local_98.elementCount = (local_a0->_reader).nestingLimit;
  if (bVar14) {
    local_98.segment._0_4_ = 0;
    local_98.segment._4_4_ = 0;
    local_98.capTable._0_4_ = 0;
    local_98.capTable._4_4_ = 0;
    local_98.elementCount = 0x7fffffff;
  }
  else {
    local_98.segment._0_4_ = *(undefined4 *)&(local_a0->_reader).segment;
    local_98.segment._4_4_ = *(undefined4 *)((long)&(local_a0->_reader).segment + 4);
    local_98.capTable._0_4_ = *(undefined4 *)&(local_a0->_reader).capTable;
    local_98.capTable._4_4_ = *(undefined4 *)((long)&(local_a0->_reader).capTable + 4);
  }
  _::PointerReader::getList(&local_60,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
  LVar6 = local_60.elementCount;
  if (local_60.elementCount != 0) {
    EVar11 = 0;
    do {
      _::ListReader::getStructElement((StructReader *)&local_98,&local_60,EVar11);
      if (local_98.structDataSize < 0x40) {
        WVar8.offsetAndKind.value = 0;
        WVar8.field_1 = (anon_union_4_5_35ddcec3_for_WirePointer_1)0x0;
      }
      else {
        WVar8 = *(WirePointer *)local_98.ptr;
      }
      if (local_d8.capTable == (CapTableReader *)local_d8.data) {
        sVar10 = (long)local_d8.capTable - (long)local_d8.segment >> 2;
        if ((SegmentReader *)local_d8.capTable == local_d8.segment) {
          sVar10 = 4;
        }
        kj::Vector<unsigned_long>::setCapacity((Vector<unsigned_long> *)&local_d8,sVar10);
      }
      ((SegmentReader *)local_d8.capTable)->arena = (Arena *)WVar8;
      local_d8.capTable = (CapTableReader *)&((SegmentReader *)local_d8.capTable)->id;
      EVar11 = EVar11 + 1;
    } while (LVar6 != EVar11);
  }
  pCVar2 = local_108.capTable;
  pSVar12 = local_108.segment;
  if (local_108.segment != (SegmentReader *)local_108.capTable) {
    uVar5 = (long)local_108.capTable - (long)local_108.segment >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_108.segment,local_108.capTable,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar12,pCVar2);
  }
  pCVar2 = local_d8.capTable;
  pSVar12 = local_d8.segment;
  pSVar13 = local_108.segment;
  if (local_d8.segment != (SegmentReader *)local_d8.capTable) {
    uVar5 = (long)local_d8.capTable - (long)local_d8.segment >> 3;
    lVar1 = 0x3f;
    if (uVar5 != 0) {
      for (; uVar5 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    std::__introsort_loop<unsigned_long*,long,__gnu_cxx::__ops::_Iter_less_iter>
              (local_d8.segment,local_d8.capTable,((uint)lVar1 ^ 0x3f) * 2 ^ 0x7e);
    std::__final_insertion_sort<unsigned_long*,__gnu_cxx::__ops::_Iter_less_iter>(pSVar12,pCVar2);
    pSVar12 = local_d8.segment;
    pSVar13 = local_108.segment;
  }
  do {
    if (pSVar13 == (SegmentReader *)local_108.capTable) {
      if (pSVar12 != (SegmentReader *)local_d8.capTable) {
        replacementIsNewer(this);
      }
LAB_00144610:
      pRVar4 = local_a0;
      pvVar3 = local_d8.data;
      pCVar2 = local_d8.capTable;
      pSVar12 = local_d8.segment;
      if (local_d8.segment != (SegmentReader *)0x0) {
        local_d8.segment = (SegmentReader *)0x0;
        local_d8.capTable = (CapTableReader *)0x0;
        local_d8.data = (SegmentReader *)0x0;
        (**(code **)*local_d8.pointers)
                  (local_d8.pointers,pSVar12,8,(long)pCVar2 - (long)pSVar12 >> 3,
                   (long)pvVar3 - (long)pSVar12 >> 3,0);
      }
      pvVar3 = local_108.data;
      pCVar2 = local_108.capTable;
      pSVar12 = local_108.segment;
      if (local_108.segment != (SegmentReader *)0x0) {
        local_108.segment = (SegmentReader *)0x0;
        local_108.capTable = (CapTableReader *)0x0;
        local_108.data = (SegmentReader *)0x0;
        (**(code **)*local_108.pointers)
                  (local_108.pointers,pSVar12,8,(long)pCVar2 - (long)pSVar12 >> 3,
                   (long)pvVar3 - (long)pSVar12 >> 3,0);
      }
      bVar14 = (local_68->_reader).pointerCount < 4;
      local_98.ptr = (byte *)((local_68->_reader).pointers + 3);
      if (bVar14) {
        local_98.ptr = (byte *)(WirePointer *)0x0;
      }
      iVar9 = 0x7fffffff;
      local_98.elementCount = (local_68->_reader).nestingLimit;
      if (bVar14) {
        local_98.elementCount = 0x7fffffff;
        local_98.segment._0_4_ = 0;
        local_98.segment._4_4_ = 0;
        local_98.capTable._0_4_ = 0;
        local_98.capTable._4_4_ = 0;
      }
      else {
        local_98.segment._0_4_ = *(undefined4 *)&(local_68->_reader).segment;
        local_98.segment._4_4_ = *(undefined4 *)((long)&(local_68->_reader).segment + 4);
        local_98.capTable._0_4_ = *(undefined4 *)&(local_68->_reader).capTable;
        local_98.capTable._4_4_ = *(undefined4 *)((long)&(local_68->_reader).capTable + 4);
      }
      _::PointerReader::getList(&local_60,(PointerReader *)&local_98,INLINE_COMPOSITE,(word *)0x0);
      bVar14 = 3 < (pRVar4->_reader).pointerCount;
      local_108.data = (WirePointer *)0x0;
      if (bVar14) {
        iVar9 = (pRVar4->_reader).nestingLimit;
        local_108.data = (pRVar4->_reader).pointers + 3;
      }
      uVar15 = 0;
      uVar16 = 0;
      uVar17 = 0;
      uVar18 = 0;
      if (bVar14) {
        uVar15 = *(undefined4 *)&(pRVar4->_reader).segment;
        uVar16 = *(undefined4 *)((long)&(pRVar4->_reader).segment + 4);
        uVar17 = *(undefined4 *)&(pRVar4->_reader).capTable;
        uVar18 = *(undefined4 *)((long)&(pRVar4->_reader).capTable + 4);
      }
      local_108.segment = (SegmentReader *)CONCAT44(uVar16,uVar15);
      local_108.capTable = (CapTableReader *)CONCAT44(uVar18,uVar17);
      local_108.pointers = (WirePointer *)CONCAT44(local_108.pointers._4_4_,iVar9);
      _::PointerReader::getList(&local_98,(PointerReader *)&local_108,INLINE_COMPOSITE,(word *)0x0);
      if (local_60.elementCount < local_98.elementCount) {
        replacementIsNewer(this);
      }
      else if (local_98.elementCount < local_60.elementCount) {
        replacementIsOlder(this);
      }
      LVar6 = local_98.elementCount;
      if (local_60.elementCount < local_98.elementCount) {
        LVar6 = local_60.elementCount;
      }
      if (LVar6 != 0) {
        EVar11 = 0;
        do {
          _::ListReader::getStructElement(&local_108,&local_60,EVar11);
          _::ListReader::getStructElement(&local_d8,&local_98,EVar11);
          checkCompatibility(this,(Reader *)&local_108,(Reader *)&local_d8);
          EVar11 = EVar11 + 1;
        } while (LVar6 != EVar11);
      }
      return;
    }
    if (pSVar12 == (SegmentReader *)local_d8.capTable) {
      replacementIsOlder(this);
      goto LAB_00144610;
    }
    if (pSVar13->arena < pSVar12->arena) {
      replacementIsOlder(this);
      pSVar13 = (SegmentReader *)&pSVar13->id;
    }
    else {
      if (pSVar12->arena < pSVar13->arena) {
        replacementIsNewer(this);
      }
      else {
        pSVar13 = (SegmentReader *)&pSVar13->id;
      }
      pSVar12 = (SegmentReader *)&pSVar12->id;
    }
  } while( true );
}

Assistant:

void checkCompatibility(const schema::Node::Interface::Reader& interfaceNode,
                          const schema::Node::Interface::Reader& replacement) {
    {
      // Check superclasses.

      kj::Vector<uint64_t> superclasses;
      kj::Vector<uint64_t> replacementSuperclasses;
      for (auto superclass: interfaceNode.getSuperclasses()) {
        superclasses.add(superclass.getId());
      }
      for (auto superclass: replacement.getSuperclasses()) {
        replacementSuperclasses.add(superclass.getId());
      }
      std::sort(superclasses.begin(), superclasses.end());
      std::sort(replacementSuperclasses.begin(), replacementSuperclasses.end());

      auto iter = superclasses.begin();
      auto replacementIter = replacementSuperclasses.begin();

      while (iter != superclasses.end() || replacementIter != replacementSuperclasses.end()) {
        if (iter == superclasses.end()) {
          replacementIsNewer();
          break;
        } else if (replacementIter == replacementSuperclasses.end()) {
          replacementIsOlder();
          break;
        } else if (*iter < *replacementIter) {
          replacementIsOlder();
          ++iter;
        } else if (*iter > *replacementIter) {
          replacementIsNewer();
          ++replacementIter;
        } else {
          ++iter;
          ++replacementIter;
        }
      }
    }

    auto methods = interfaceNode.getMethods();
    auto replacementMethods = replacement.getMethods();

    if (replacementMethods.size() > methods.size()) {
      replacementIsNewer();
    } else if (replacementMethods.size() < methods.size()) {
      replacementIsOlder();
    }

    uint count = kj::min(methods.size(), replacementMethods.size());

    for (uint i = 0; i < count; i++) {
      checkCompatibility(methods[i], replacementMethods[i]);
    }
  }